

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Naming.hpp
# Opt level: O1

string * ArrVarName(string *__return_storage_ptr__,string *brastr,Doublet *dket,string *prefix)

{
  size_type sVar1;
  pointer pcVar2;
  string str;
  string tag;
  
  sVar1 = (dket->tag)._M_string_length;
  if (sVar1 == 0) {
    tag._M_dataplus._M_p = (pointer)&tag.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tag,"");
  }
  else {
    tag._M_dataplus._M_p = (pointer)&tag.field_2;
    pcVar2 = (dket->tag)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&tag,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)&tag);
  }
  StringBuilder<char[6],std::__cxx11::string&,std::__cxx11::string_const&,char_const(&)[2],char_const&,char_const(&)[2],char_const&>
            (&str,(char (*) [6])"INT__",&tag,brastr,(char (*) [2])0x149cdb,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" +
             (long)(dket->left).ijk._M_elems[1] + (long)(dket->left).ijk._M_elems[0] +
             (long)(dket->left).ijk._M_elems[2],(char (*) [2])0x149cdb,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" +
             (long)(dket->right).ijk._M_elems[1] + (long)(dket->right).ijk._M_elems[0] +
             (long)(dket->right).ijk._M_elems[2]);
  if (prefix->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p == &str.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(str.field_2._M_allocated_capacity._1_7_,str.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = str.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = str._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(str.field_2._M_allocated_capacity._1_7_,str.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = str._M_string_length;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    str._M_dataplus._M_p = (pointer)&str.field_2;
  }
  else {
    StringBuilder<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (__return_storage_ptr__,prefix,(char (*) [2])0x149cdb,&str);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tag._M_dataplus._M_p != &tag.field_2) {
    operator_delete(tag._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string ArrVarName(const std::string & brastr, Doublet dket, const std::string & prefix = "")
{
    std::string tag = (dket.tag.size() ? dket.tag + "_" : "");
    std::string str = StringBuilder("INT__" , tag, brastr, "_", amchar[dket.left.am()],
                                    "_", amchar[dket.right.am()]);
    
    if(prefix.size())
        return StringBuilder(prefix, "_", str);
    else
        return str;
}